

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h2-proxy.c
# Opt level: O0

void cf_h2_proxy_adjust_pollset(Curl_cfilter *cf,Curl_easy *data,easy_pollset *ps)

{
  long *plVar1;
  undefined8 uVar2;
  int32_t iVar3;
  int32_t iVar4;
  int iVar5;
  bool local_3e;
  _Bool local_3d;
  byte local_3c;
  byte local_3b;
  _Bool s_exhaust;
  _Bool c_exhaust;
  cf_call_data save;
  _Bool want_send;
  _Bool want_recv;
  curl_socket_t sock;
  cf_h2_proxy_ctx *ctx;
  easy_pollset *ps_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  plVar1 = (long *)cf->ctx;
  save.data._4_4_ = Curl_conn_cf_get_socket(cf,data);
  Curl_pollset_check(data,ps,save.data._4_4_,(_Bool *)((long)&save.data + 3),
                     (_Bool *)((long)&save.data + 2));
  if ((*plVar1 != 0) && (((save.data._3_1_ & 1) != 0 || ((save.data._2_1_ & 1) != 0)))) {
    uVar2 = *(undefined8 *)((long)cf->ctx + 8);
    *(Curl_easy **)((long)cf->ctx + 8) = data;
    iVar3 = nghttp2_session_get_remote_window_size((nghttp2_session *)*plVar1);
    local_3b = 0;
    if (-1 < (int)plVar1[0x24]) {
      iVar4 = nghttp2_session_get_stream_remote_window_size
                        ((nghttp2_session *)*plVar1,(int32_t)plVar1[0x24]);
      local_3b = iVar4 != 0 ^ 0xff;
    }
    local_3c = 1;
    if (((save.data._3_1_ & 1) == 0) && (local_3c = 1, iVar3 != 0)) {
      local_3c = local_3b & 1;
    }
    save.data._3_1_ = local_3c;
    if (((local_3b & 1) != 0) || (local_3d = true, (save.data._2_1_ & 1) == 0)) {
      local_3e = false;
      if (iVar3 != 0) {
        iVar5 = nghttp2_session_want_write((nghttp2_session *)*plVar1);
        local_3e = iVar5 != 0;
      }
      local_3d = local_3e;
    }
    save.data._2_1_ = local_3d;
    Curl_pollset_set(data,ps,save.data._4_4_,(_Bool)(save.data._3_1_ & 1),local_3d);
    *(undefined8 *)((long)cf->ctx + 8) = uVar2;
  }
  return;
}

Assistant:

static void cf_h2_proxy_adjust_pollset(struct Curl_cfilter *cf,
                                       struct Curl_easy *data,
                                       struct easy_pollset *ps)
{
  struct cf_h2_proxy_ctx *ctx = cf->ctx;
  curl_socket_t sock = Curl_conn_cf_get_socket(cf, data);
  bool want_recv, want_send;

  Curl_pollset_check(data, ps, sock, &want_recv, &want_send);
  if(ctx->h2 && (want_recv || want_send)) {
    struct cf_call_data save;
    bool c_exhaust, s_exhaust;

    CF_DATA_SAVE(save, cf, data);
    c_exhaust = !nghttp2_session_get_remote_window_size(ctx->h2);
    s_exhaust = ctx->tunnel.stream_id >= 0 &&
                !nghttp2_session_get_stream_remote_window_size(
                   ctx->h2, ctx->tunnel.stream_id);
    want_recv = (want_recv || c_exhaust || s_exhaust);
    want_send = (!s_exhaust && want_send) ||
                (!c_exhaust && nghttp2_session_want_write(ctx->h2));

    Curl_pollset_set(data, ps, sock, want_recv, want_send);
    CF_DATA_RESTORE(cf, save);
  }
}